

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_attribute
               (Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,int index,
               int wmask,int flags)

{
  byte bVar1;
  int iVar2;
  RegisterType RVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  char *fmt;
  undefined4 in_register_00000084;
  char index_str [16];
  char regnum_str [16];
  char acStack_98 [64];
  char local_58 [40];
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  pcVar4 = get_D3D_register_string
                     (ctx,regtype,regnum,local_58 + 0x10,CONCAT44(in_register_00000084,index));
  snprintf(acStack_98,0x40,"%s%s",pcVar4,local_58 + 0x10);
  if (index != 0) {
    snprintf(local_58,0x10,"%u",(ulong)(uint)index);
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if ((flags & 4U) != 0) {
      pcVar4 = ctx->profile->name;
      fmt = "centroid unsupported in %s profile";
      goto LAB_0010e3af;
    }
    if ((regtype & ~REG_TYPE_INPUT) == REG_TYPE_COLOROUT) {
      push_output(ctx,&ctx->outputs);
      sVar5 = buffer_size(ctx->outputs);
      if (sVar5 == 0) {
        output_line(ctx,"struct %s_Output",ctx->mainfn);
        output_line(ctx,"{");
      }
      ctx->indent = ctx->indent + 1;
      if (regtype == REG_TYPE_DEPTHOUT) {
        pcVar4 = "float %s [[depth(any)]];";
        goto LAB_0010e478;
      }
      if (regtype != REG_TYPE_COLOROUT) goto switchD_0010e393_caseD_1;
      pcVar4 = "float4 %s [[color(%d)]];";
      uVar8 = (ulong)(uint)regnum;
      goto LAB_0010e468;
    }
    if ((REG_TYPE_MISCTYPE < regtype) ||
       ((0x2000aU >> (regtype & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0)) {
      fmt = "%s";
      pcVar4 = "unknown pixel shader attribute register";
      goto LAB_0010e3af;
    }
    push_output(ctx,&ctx->inputs);
    sVar5 = buffer_size(ctx->inputs);
    if (sVar5 == 0) {
      output_line(ctx,"struct %s_Input",ctx->mainfn);
      output_line(ctx,"{");
    }
    ctx->indent = ctx->indent + 1;
    if (regtype == REG_TYPE_MISCTYPE) {
      if (regnum == 0) {
        pcVar4 = "float4 %s [[position]];";
      }
      else {
        if (regnum != 1) {
          failf(ctx,"%s","BUG: unhandled misc register");
          goto LAB_0010e5d2;
        }
        pcVar4 = "bool %s [[front_facing]];";
      }
LAB_0010e5c5:
      output_line(ctx,pcVar4,acStack_98);
LAB_0010e5d2:
      lVar6 = (long)ctx->output_stack_len;
      if (lVar6 < 1) goto LAB_0010e64c;
      ctx->output_stack_len = (int)(lVar6 - 1U);
      ctx->output = ctx->output_stack[lVar6 - 1U & 0xffffffff];
      ctx->indent = ctx->indent_stack[lVar6 + -1];
    }
    else {
      if (usage == MOJOSHADER_USAGE_FOG) {
        pcVar4 = "float4 %s [[user(fog)]];";
        goto LAB_0010e5c5;
      }
      if (usage == MOJOSHADER_USAGE_COLOR) {
        output_line(ctx,"float4 %s [[user(color%d)]];",acStack_98,(ulong)(uint)index);
        goto LAB_0010e5d2;
      }
      if (usage != MOJOSHADER_USAGE_TEXCOORD) goto LAB_0010e5d2;
      bVar1 = ctx->major_ver;
      uVar7 = (uint)ctx->minor_ver;
      if (ctx->minor_ver == 0xff) {
        uVar7 = 0;
      }
      output_line(ctx,"float4 %s [[user(texcoord%d)]];",acStack_98,(ulong)(uint)index);
      pop_output(ctx);
      if ((uVar7 | (uint)bVar1 << 0x10) < 0x10004) {
        return;
      }
    }
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"#define %s input.%s",acStack_98);
    lVar6 = (long)ctx->output_stack_len;
    if (lVar6 < 1) goto LAB_0010e64c;
    ctx->output_stack_len = (int)(lVar6 - 1U);
    uVar8 = lVar6 - 1U & 0xffffffff;
    goto LAB_0010e4ff;
  }
  if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
    fmt = "%s";
    pcVar4 = "Unknown shader type";
LAB_0010e3af:
    failf(ctx,fmt,pcVar4);
    return;
  }
  if (ctx->major_ver < 3) {
    if (regtype == REG_TYPE_OUTPUT) {
      usage = MOJOSHADER_USAGE_TEXCOORD;
      index = regnum;
    }
    else {
      RVar3 = REG_TYPE_OUTPUT;
      if (regtype == REG_TYPE_ATTROUT) {
        usage = MOJOSHADER_USAGE_COLOR;
        index = regnum;
        regtype = RVar3;
      }
      else if ((regtype == REG_TYPE_RASTOUT) && (index = regnum, regtype = RVar3, (uint)regnum < 3))
      {
        usage = *(MOJOSHADER_usage *)(&DAT_0012b3ec + (ulong)(uint)regnum * 4);
      }
    }
  }
  if (regtype != REG_TYPE_OUTPUT) {
    if (regtype != REG_TYPE_INPUT) {
      fmt = "%s";
      pcVar4 = "unknown vertex shader attribute register";
      goto LAB_0010e3af;
    }
    push_output(ctx,&ctx->inputs);
    sVar5 = buffer_size(ctx->inputs);
    if (sVar5 == 0) {
      output_line(ctx,"struct %s_Input",ctx->mainfn);
      output_line(ctx,"{");
    }
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"float4 %s [[attribute(%d)]];",acStack_98,(ulong)(uint)regnum);
    lVar6 = (long)ctx->output_stack_len;
    if (lVar6 < 1) goto LAB_0010e64c;
    ctx->output_stack_len = (int)(lVar6 - 1U);
    ctx->output = ctx->output_stack[lVar6 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar6 + -1];
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    pcVar4 = "#define %s input.%s";
    goto LAB_0010e4d6;
  }
  push_output(ctx,&ctx->outputs);
  sVar5 = buffer_size(ctx->outputs);
  if (sVar5 == 0) {
    output_line(ctx,"struct %s_Output",ctx->mainfn);
    output_line(ctx,"{");
  }
  ctx->indent = ctx->indent + 1;
  switch(usage) {
  case MOJOSHADER_USAGE_POSITION:
    pcVar4 = "float4 %s [[position]];";
    break;
  default:
    goto switchD_0010e393_caseD_1;
  case MOJOSHADER_USAGE_POINTSIZE:
    pcVar4 = "float4 %s [[point_size]];";
    break;
  case MOJOSHADER_USAGE_TEXCOORD:
    pcVar4 = "float4 %s [[user(texcoord%d)]];";
    goto LAB_0010e45f;
  case MOJOSHADER_USAGE_COLOR:
    pcVar4 = "float4 %s [[user(color%d)]];";
LAB_0010e45f:
    uVar8 = (ulong)(uint)index;
LAB_0010e468:
    output_line(ctx,pcVar4,acStack_98,uVar8);
    goto switchD_0010e393_caseD_1;
  case MOJOSHADER_USAGE_FOG:
    pcVar4 = "float4 %s [[user(fog)]];";
  }
LAB_0010e478:
  output_line(ctx,pcVar4,acStack_98);
switchD_0010e393_caseD_1:
  lVar6 = (long)ctx->output_stack_len;
  if (0 < lVar6) {
    ctx->output_stack_len = (int)(lVar6 - 1U);
    ctx->output = ctx->output_stack[lVar6 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar6 + -1];
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    pcVar4 = "#define %s output.%s";
LAB_0010e4d6:
    output_line(ctx,pcVar4,acStack_98);
    lVar6 = (long)ctx->output_stack_len;
    if (0 < lVar6) {
      uVar7 = ctx->output_stack_len - 1;
      uVar8 = (ulong)uVar7;
      ctx->output_stack_len = uVar7;
LAB_0010e4ff:
      ctx->output = ctx->output_stack[uVar8];
      ctx->indent = ctx->indent_stack[lVar6 + -1];
      push_output(ctx,&ctx->mainline);
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"#undef %s",acStack_98);
      iVar2 = ctx->output_stack_len;
      if (0 < (long)iVar2) {
        ctx->output_stack_len = iVar2 - 1U;
        ctx->output = ctx->output_stack[iVar2 - 1U];
        ctx->indent = ctx->indent_stack[(long)iVar2 + -1];
        return;
      }
    }
  }
LAB_0010e64c:
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    char index_str[16] = { '\0' };
    char var[64];

    get_METAL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;
            output_line(ctx, "float4 %s [[attribute(%d)]];", var, regnum);
            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: might trigger unused var warnings in Clang.
            //output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            output_line(ctx, "#define %s input.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;

            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    output_line(ctx, "float4 %s [[position]];", var);
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    output_line(ctx, "float4 %s [[point_size]];", var);
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);
                    break;
                case MOJOSHADER_USAGE_FOG:
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float4 &%s = output.%s;", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_METAL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if ((regtype == REG_TYPE_COLOROUT) || (regtype == REG_TYPE_DEPTHOUT))
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_COLOROUT)
                output_line(ctx, "float4 %s [[color(%d)]];", var, regnum);
            else if (regtype == REG_TYPE_DEPTHOUT)
                output_line(ctx, "float %s [[depth(any)]];", var);

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float%s &%s = output.%s;", (regtype == REG_TYPE_DEPTHOUT) ? "" : "4", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) ||
                 (regtype == REG_TYPE_INPUT) ||
                 (regtype == REG_TYPE_MISCTYPE))
        {
            int skipreference = 0;
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_MISCTYPE)
            {
                const MiscTypeType mt = (MiscTypeType) regnum;
                if (mt == MISCTYPE_TYPE_FACE)
                    output_line(ctx, "bool %s [[front_facing]];", var);
                else if (mt == MISCTYPE_TYPE_POSITION)
                    output_line(ctx, "float4 %s [[position]];", var);
                else
                    fail(ctx, "BUG: unhandled misc register");
            } // else if

            else
            {
                if (usage == MOJOSHADER_USAGE_TEXCOORD)
                {
                    // ps_1_1 does a different hack for this attribute.
                    //  Refer to emit_METAL_global()'s REG_TYPE_ADDRESS code.
                    if (!shader_version_atleast(ctx, 1, 4))
                        skipreference = 1;
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                } // if

                else if (usage == MOJOSHADER_USAGE_COLOR)
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);

                else if (usage == MOJOSHADER_USAGE_FOG)
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
            } // else

            pop_output(ctx);

            // !!! FIXME: can cause unused var warnings in Clang...
            #if 0
            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            if ((regtype == REG_TYPE_MISCTYPE)&&(regnum == MISCTYPE_TYPE_FACE))
                output_line(ctx, "constant bool &%s = input.%s;", var, var);
            else if (!skipreference)
                output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            pop_output(ctx);
            #endif

            if (!skipreference)
            {
                push_output(ctx, &ctx->mainline_top);
                ctx->indent++;
                output_line(ctx, "#define %s input.%s", var, var);
                pop_output(ctx);
                push_output(ctx, &ctx->mainline);
                ctx->indent++;
                output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
                pop_output(ctx);
            } // if
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}